

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

char * nvis(char *mbdst,size_t dlen,wchar_t c,wchar_t flags,wchar_t nextc)

{
  wchar_t wVar1;
  char local_2e;
  undefined1 local_2d;
  wchar_t ret;
  wchar_t wStack_28;
  char cc [2];
  wchar_t nextc_local;
  wchar_t flags_local;
  wchar_t c_local;
  size_t dlen_local;
  char *mbdst_local;
  
  local_2e = (char)c;
  local_2d = (undefined1)nextc;
  ret = nextc;
  wStack_28 = flags;
  _flags_local = dlen;
  dlen_local = (size_t)mbdst;
  wVar1 = istrsenvisx((char **)&dlen_local,(size_t *)&flags_local,&local_2e,1,flags,"",
                      (wchar_t *)0x0);
  if (wVar1 < L'\0') {
    mbdst_local = (char *)0x0;
  }
  else {
    mbdst_local = (char *)(dlen_local + (long)wVar1);
  }
  return mbdst_local;
}

Assistant:

char *
nvis(char *mbdst, size_t dlen, int c, int flags, int nextc)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, &dlen, cc, 1, flags, "", NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}